

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O2

int run_test_fs_poll_close_request_multi_stop_start(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop_00;
  undefined8 uVar3;
  char *pcVar4;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  
  remove("testfile");
  iVar1 = uv_loop_init(&loop);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(&loop,&poll_handle);
    if (iVar1 == 0) {
      iVar1 = 0xb;
      do {
        iVar1 = iVar1 + -1;
        if (iVar1 == 0) {
          uv_close(&poll_handle,close_cb);
          while (close_cb_called == 0) {
            uv_run(&loop,1);
          }
          if (close_cb_called == 1) {
            iVar1 = uv_loop_close(&loop);
            if (iVar1 == 0) {
              loop_00 = (uv_loop_t *)uv_default_loop();
              close_loop(loop_00);
              uVar3 = uv_default_loop();
              iVar1 = uv_loop_close(uVar3);
              if (iVar1 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "0 == uv_loop_close(uv_default_loop())";
              uVar3 = 0x10d;
            }
            else {
              pcVar4 = "0 == uv_loop_close(&loop)";
              uVar3 = 0x10b;
            }
          }
          else {
            pcVar4 = "close_cb_called == 1";
            uVar3 = 0x109;
          }
          goto LAB_0011eaec;
        }
        iVar2 = uv_fs_poll_stop(&poll_handle);
        if (iVar2 != 0) {
          pcVar4 = "0 == uv_fs_poll_stop(&poll_handle)";
          uVar3 = 0x103;
          goto LAB_0011eaec;
        }
        iVar2 = uv_fs_poll_start(&poll_handle,poll_cb_fail,"testfile",100);
      } while (iVar2 == 0);
      pcVar4 = "0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100)";
      uVar3 = 0x104;
    }
    else {
      pcVar4 = "0 == uv_fs_poll_init(&loop, &poll_handle)";
      uVar3 = 0x100;
    }
  }
  else {
    pcVar4 = "0 == uv_loop_init(&loop)";
    uVar3 = 0xfe;
  }
LAB_0011eaec:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_poll_close_request_multi_stop_start) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;
  int i;

  remove(FIXTURE);

  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_fs_poll_init(&loop, &poll_handle));

  for (i = 0; i < 10; ++i) {
    ASSERT(0 == uv_fs_poll_stop(&poll_handle));
    ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  }
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT(close_cb_called == 1);

  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}